

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdFreePsbtPubkeyList(void *handle,void *pubkey_list_handle)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this;
  string local_48;
  
  cfd::Initialize();
  if (pubkey_list_handle != (void *)0x0) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PsbtPubkeyList","");
    cfd::capi::CheckBuffer(pubkey_list_handle,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    this = *(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)
            ((long)pubkey_list_handle + 0x18);
    if (this != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)pubkey_list_handle + 0x18) = 0;
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PsbtPubkeyList","");
    cfd::capi::FreeBuffer(pubkey_list_handle,&local_48,0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return 0;
}

Assistant:

int CfdFreePsbtPubkeyList(void* handle, void* pubkey_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (pubkey_list_handle != nullptr) {
      CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
      CfdCapiPsbtPubkeyListHandle* list_handle =
          static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
      if (list_handle->key_list != nullptr) {
        delete list_handle->key_list;
        list_handle->key_list = nullptr;
      }
      FreeBuffer(
          pubkey_list_handle, kPrefixPsbtPubkeyList,
          sizeof(CfdCapiPsbtPubkeyListHandle));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}